

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
mocker::ir::Interpreter::executePhis
          (Interpreter *this,
          vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
          *phis)

{
  element_type **ppeVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pCVar5;
  _Elt_pointer pAVar6;
  Interpreter *pIVar7;
  bool bVar8;
  int64_t iVar9;
  ulong uVar10;
  pointer pCVar11;
  pointer pCVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  size_t sVar13;
  size_t sVar14;
  vector<Change,_std::allocator<Change>_> *__range2;
  long lVar15;
  ulong uVar16;
  pointer pCVar17;
  pointer pCVar18;
  pointer psVar19;
  Change *change;
  pointer reg;
  _Elt_pointer pAVar20;
  vector<Change,_std::allocator<Change>_> changes;
  vector<Change,_std::allocator<Change>_> local_98;
  _Elt_pointer local_78;
  pointer local_70;
  size_t local_68;
  size_t local_60;
  pointer local_58;
  Interpreter *local_50;
  pointer local_48;
  ulong local_40;
  pointer local_38;
  
  local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pAVar20 = (this->ars).c.
            super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar20 ==
      (this->ars).c.
      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pAVar20 = (this->ars).c.
              super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  psVar19 = (phis->
            super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (phis->
             super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pCVar17 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar6 = pAVar20;
  pIVar7 = this;
  pCVar5 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar19 != local_58) {
    do {
      local_50 = pIVar7;
      local_78 = pAVar6;
      peVar2 = (psVar19->super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      reg = (peVar2->options).
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (peVar2->options).
                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (reg == local_38) {
LAB_0010a646:
        __assert_fail("found",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x1bb,
                      "void mocker::ir::Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &)"
                     );
      }
      bVar8 = false;
      local_70 = psVar19;
      do {
        sVar13 = ((reg->second).super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->id;
        sVar14 = pAVar20[-1].lastBB;
        if (sVar13 == sVar14) {
          local_68 = sVar14;
          local_60 = sVar13;
          iVar9 = readVal(this,&reg->first);
          pCVar5 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          peVar2 = (psVar19->super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          if (local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            if ((long)local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar15 = (long)local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
            uVar16 = lVar15 * -0x5555555555555555;
            uVar10 = uVar16;
            if (local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar10 = 1;
            }
            local_40 = uVar10 + uVar16;
            if (0x555555555555554 < local_40) {
              local_40 = 0x555555555555555;
            }
            if (CARRY8(uVar10,uVar16)) {
              local_40 = 0x555555555555555;
            }
            if (local_40 == 0) {
              pCVar11 = (pointer)0x0;
              pCVar17 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            else {
              local_48 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                         super__Vector_impl_data._M_start;
              pCVar11 = (pointer)operator_new(local_40 * 0x18);
              pCVar17 = local_48;
            }
            this = local_50;
            psVar19 = local_70;
            peVar3 = (peVar2->super_Definition).dest.
                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var4 = (peVar2->super_Definition).dest.
                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            ppeVar1 = &(pCVar11->reg).
                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      lVar15;
            *ppeVar1 = &peVar3->super_Addr;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppeVar1 + 1))->_M_pi = p_Var4;
            ppeVar1[2] = (element_type *)iVar9;
            pCVar18 = pCVar11;
            for (pCVar12 = pCVar17; pCVar5 != pCVar12; pCVar12 = pCVar12 + 1) {
              (pCVar18->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (pCVar12->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
              (pCVar18->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = (pCVar12->reg).
                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              (pCVar12->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (pCVar18->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = p_Var4;
              (pCVar12->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              pCVar18->val = pCVar12->val;
              pCVar18 = pCVar18 + 1;
            }
            if (pCVar17 != (pointer)0x0) {
              operator_delete(pCVar17,(long)local_98.
                                            super__Vector_base<Change,_std::allocator<Change>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pCVar17);
            }
            local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pCVar11 + local_40;
            local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
            super__Vector_impl_data._M_start = pCVar11;
          }
          else {
            peVar3 = (peVar2->super_Definition).dest.
                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var4 = (peVar2->super_Definition).dest.
                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            ((local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
              super__Vector_impl_data._M_finish)->reg).
            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &peVar3->super_Addr;
            ((local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
              super__Vector_impl_data._M_finish)->reg).
            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var4;
            (local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
             super__Vector_impl_data._M_finish)->val = iVar9;
            psVar19 = local_70;
            pCVar18 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
          super__Vector_impl_data._M_finish = pCVar18 + 1;
          bVar8 = true;
          sVar13 = local_60;
          sVar14 = local_68;
          pAVar20 = local_78;
        }
      } while ((sVar13 != sVar14) && (reg = reg + 1, reg != local_38));
      if (!bVar8) goto LAB_0010a646;
      psVar19 = psVar19 + 1;
      pCVar17 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                super__Vector_impl_data._M_start;
      pAVar6 = local_78;
      pIVar7 = local_50;
      pCVar5 = local_98.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (psVar19 != local_58);
  }
  for (; pCVar17 != pCVar5; pCVar17 = pCVar17 + 1) {
    writeReg<long>(this,&pCVar17->reg,pCVar17->val);
  }
  std::vector<Change,_std::allocator<Change>_>::~vector(&local_98);
  return;
}

Assistant:

void Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &phis) {
  struct Change {
    Change(std::shared_ptr<Addr> reg, int64_t val)
        : reg(std::move(reg)), val(val) {}
    std::shared_ptr<Addr> reg;
    std::int64_t val;
  };
  std::vector<Change> changes;
  auto &ar = ars.top();

  for (const auto &p : phis) {
    bool found = false;
    for (auto &option : p->getOptions()) {
      if (option.second->getID() == ar.lastBB) {
        auto val = readVal(option.first);
        changes.emplace_back(p->getDest(), (std::int64_t)val);
        found = true;
        break;
      }
    }
    assert(found);
  }

  for (const auto &change : changes) {
    writeReg(change.reg, change.val);
  }
}